

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O2

tls_object * __thiscall booster::details::pthread_key::get_object(pthread_key *this)

{
  tls_object *this_00;
  intrusive_ptr<booster::details::key> local_18;
  
  this_00 = (tls_object *)pthread_getspecific(this->key_);
  if (this_00 == (tls_object *)0x0) {
    this_00 = (tls_object *)operator_new(0x10);
    local_18.p_ = &this->super_key;
    atomic_counter::inc(&(this->super_key).super_refcounted.refs_);
    tls_object::tls_object(this_00,&local_18);
    intrusive_ptr<booster::details::key>::~intrusive_ptr(&local_18);
    pthread_setspecific(this->key_,this_00);
  }
  return this_00;
}

Assistant:

tls_object *get_object()
			{
				void *p=pthread_getspecific(key_);
				if(p)
					return static_cast<tls_object*>(p);
				tls_object *res = new tls_object(intrusive_ptr<key>(this));
				pthread_setspecific(key_,static_cast<void*>(res));
				return res;
			}